

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall CaDiCaL::Solver::add(Solver *this,int lit)

{
  FILE *__stream;
  uint *puVar1;
  State SVar2;
  uint uVar3;
  undefined8 in_RCX;
  Solver *pSVar4;
  uint lit_00;
  uint lit_01;
  uint lit_02;
  uint lit_03;
  long extraout_RDX;
  Solver *pSVar5;
  char *pcVar6;
  char *pcVar7;
  Solver *pSVar8;
  uint in_R8D;
  uint in_R9D;
  ulong unaff_R12;
  long lVar9;
  uint *puVar10;
  ulong unaff_R15;
  bool bVar11;
  
  pSVar5 = (Solver *)(ulong)(uint)lit;
  bVar11 = this->internal == (Internal *)0x0;
  __stream = (FILE *)this->trace_api_file;
  pSVar4 = (Solver *)CONCAT71((int7)((ulong)in_RCX >> 8),__stream == (FILE *)0x0 || bVar11);
  if (__stream != (FILE *)0x0 && !bVar11) {
    pSVar4 = pSVar5;
    fprintf(__stream,"%s %d\n","add");
    fflush((FILE *)this->trace_api_file);
  }
  pcVar6 = "void CaDiCaL::Solver::add(int)";
  pSVar8 = this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::add(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar4->adding_clause);
  if (this->external == (External *)0x0) {
    add();
LAB_0083c873:
    add();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083c873;
    if ((this->_state & VALID) != 0) {
      transition_to_steady_state(this);
      External::add(this->external,lit);
      this->adding_clause = lit != 0;
      if (lit == 0) {
        if (this->adding_constraint != false) {
          return;
        }
        SVar2 = STEADY;
        if (this->_state == STEADY) {
          return;
        }
      }
      else {
        SVar2 = ADDING;
        if (this->_state == ADDING) {
          return;
        }
      }
      this->_state = SVar2;
      return;
    }
  }
  add();
  add();
  if (((ulong)pcVar6 & 0x7fffffff) != 0) {
    add(pSVar8,(int)pcVar6);
    add(pSVar8,0);
    return;
  }
  pSVar8 = (Solver *)((ulong)pcVar6 & 0xffffffff);
  clause(pSVar8);
  if (((ulong)pcVar6 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar6 & 0xffffffff));
  }
  else {
    this = (Solver *)(ulong)lit_00;
    if ((lit_00 & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar6);
      add(pSVar8,lit_00);
      add(pSVar8,0);
      return;
    }
  }
  pSVar8 = (Solver *)((ulong)this & 0xffffffff);
  clause(pSVar8);
  if (((ulong)pcVar6 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar6 & 0xffffffff));
LAB_0083c93f:
    clause(pSVar5);
  }
  else {
    pSVar5 = (Solver *)(ulong)lit_01;
    if ((lit_01 & 0x7fffffff) == 0) goto LAB_0083c93f;
    this = (Solver *)((ulong)pSVar4 & 0xffffffff);
    if (((ulong)pSVar4 & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar6);
      add(pSVar8,lit_01);
      add(pSVar8,(int)pSVar4);
      add(pSVar8,0);
      return;
    }
  }
  pSVar8 = (Solver *)((ulong)this & 0xffffffff);
  clause(pSVar8);
  uVar3 = (uint)pSVar4;
  if (((ulong)pcVar6 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar6 & 0xffffffff));
LAB_0083c9c0:
    clause((Solver *)(unaff_R15 & 0xffffffff));
LAB_0083c9c8:
    clause(pSVar5);
  }
  else {
    unaff_R15 = (ulong)lit_02;
    if ((lit_02 & 0x7fffffff) == 0) goto LAB_0083c9c0;
    pSVar5 = (Solver *)((ulong)pSVar4 & 0xffffffff);
    if (((ulong)pSVar4 & 0x7fffffff) == 0) goto LAB_0083c9c8;
    this = (Solver *)(ulong)in_R8D;
    if ((in_R8D & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar6);
      add(pSVar8,lit_02);
      add(pSVar8,uVar3);
      add(pSVar8,in_R8D);
      add(pSVar8,0);
      return;
    }
  }
  pSVar4 = (Solver *)((ulong)this & 0xffffffff);
  clause(pSVar4);
  if (((ulong)pcVar6 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar6 & 0xffffffff));
LAB_0083ca5f:
    clause((Solver *)(unaff_R12 & 0xffffffff));
LAB_0083ca67:
    clause((Solver *)(unaff_R15 & 0xffffffff));
  }
  else {
    unaff_R12 = (ulong)lit_03;
    if ((lit_03 & 0x7fffffff) == 0) goto LAB_0083ca5f;
    unaff_R15 = (ulong)uVar3;
    if ((uVar3 & 0x7fffffff) == 0) goto LAB_0083ca67;
    pSVar5 = (Solver *)(ulong)in_R8D;
    if ((in_R8D & 0x7fffffff) != 0) {
      this = (Solver *)(ulong)in_R9D;
      if ((in_R9D & 0x7fffffff) != 0) {
        add(pSVar4,(int)pcVar6);
        add(pSVar4,lit_03);
        add(pSVar4,uVar3);
        add(pSVar4,in_R8D);
        add(pSVar4,in_R9D);
        add(pSVar4,0);
        return;
      }
      goto LAB_0083ca76;
    }
  }
  clause(pSVar5);
LAB_0083ca76:
  pSVar5 = (Solver *)((ulong)this & 0xffffffff);
  clause(pSVar5);
  pcVar7 = pcVar6;
  if (pcVar6 == (char *)0x0 && extraout_RDX != 0) {
LAB_0083cae4:
    clause();
    puVar10 = *(uint **)pcVar7;
    puVar1 = *(uint **)(pcVar7 + 8);
    while( true ) {
      if (puVar10 == puVar1) {
        add(pSVar5,0);
        return;
      }
      uVar3 = *puVar10;
      if ((uVar3 & 0x7fffffff) == 0) break;
      add(pSVar5,uVar3);
      puVar10 = puVar10 + 1;
    }
    clause((Solver *)(ulong)uVar3);
    return;
  }
  if (extraout_RDX != 0) {
    lVar9 = 0;
    do {
      uVar3 = *(uint *)(pcVar6 + lVar9);
      pcVar7 = (char *)(ulong)uVar3;
      if ((uVar3 & 0x7fffffff) == 0) {
        pSVar5 = (Solver *)(ulong)uVar3;
        clause(pSVar5);
        goto LAB_0083cae4;
      }
      add(pSVar5,uVar3);
      lVar9 = lVar9 + 4;
    } while (extraout_RDX << 2 != lVar9);
  }
  add(pSVar5,0);
  return;
}

Assistant:

void Solver::add (int lit) {
  TRACE ("add", lit);
  REQUIRE_VALID_STATE ();
  if (lit)
    REQUIRE_VALID_LIT (lit);
  transition_to_steady_state ();
  external->add (lit);
  adding_clause = lit;
  if (adding_clause)
    STATE (ADDING);
  else if (!adding_constraint)
    STATE (STEADY);
  LOG_API_CALL_END ("add", lit);
}